

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_functions.cc
# Opt level: O3

int64_t absl::cord_internal::cordz_should_profile_slow(SamplingState *state)

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  int64_t iVar4;
  long *in_FS_OFFSET;
  
  if ((int)_ZN4absl13cord_internal12_GLOBAL__N_121g_cordz_mean_intervalE_0 < 1) {
    state->next_sample = 0x10000;
    state->sample_stride = 0x10000;
  }
  else {
    if (_ZN4absl13cord_internal12_GLOBAL__N_121g_cordz_mean_intervalE_0 == 1) {
      state->next_sample = 1;
      state->sample_stride = 1;
      return 1;
    }
    lVar1 = in_FS_OFFSET[-6];
    if (lVar1 < 1) {
      lVar2 = *in_FS_OFFSET;
      iVar3 = state->sample_stride;
      iVar4 = profiling_internal::ExponentialBiased::GetStride
                        ((ExponentialBiased *)(*in_FS_OFFSET + -0x20),
                         (ulong)_ZN4absl13cord_internal12_GLOBAL__N_121g_cordz_mean_intervalE_0);
      state->next_sample = iVar4;
      state->sample_stride = iVar4;
      if (lVar1 != -1) {
        return iVar3;
      }
      if (in_FS_OFFSET[-6] < 2) {
        iVar4 = cordz_should_profile_slow((SamplingState *)(lVar2 + -0x30));
        if (0 < iVar4) {
          return iVar3;
        }
        return 0;
      }
      in_FS_OFFSET[-6] = in_FS_OFFSET[-6] + -1;
    }
    else {
      state->next_sample = state->next_sample + -1;
    }
  }
  return 0;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE int64_t
cordz_should_profile_slow(SamplingState& state) {

  thread_local absl::profiling_internal::ExponentialBiased
      exponential_biased_generator;
  int32_t mean_interval = get_cordz_mean_interval();

  // Check if we disabled profiling. If so, set the next sample to a "large"
  // number to minimize the overhead of the should_profile codepath.
  if (mean_interval <= 0) {
    state = {kIntervalIfDisabled, kIntervalIfDisabled};
    return 0;
  }

  // Check if we're always sampling.
  if (mean_interval == 1) {
    state = {1, 1};
    return 1;
  }

  if (cordz_next_sample.next_sample <= 0) {
    // If first check on current thread, check cordz_should_profile()
    // again using the created (initial) stride in cordz_next_sample.
    const bool initialized =
        cordz_next_sample.next_sample != kInitCordzNextSample;
    auto old_stride = state.sample_stride;
    auto stride = exponential_biased_generator.GetStride(mean_interval);
    state = {stride, stride};
    bool should_sample = initialized || cordz_should_profile() > 0;
    return should_sample ? old_stride : 0;
  }

  --state.next_sample;
  return 0;
}